

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::adjust_pitchbend(Renderer *this,int chan)

{
  int v;
  int local_18;
  int i;
  int chan_local;
  Renderer *this_local;
  
  local_18 = this->voices;
  while (v = local_18 + -1, local_18 != 0) {
    local_18 = v;
    if (((this->voice[v].status & 1) != 0) && ((uint)this->voice[v].channel == chan)) {
      recompute_freq(this,v);
    }
  }
  return;
}

Assistant:

void Renderer::adjust_pitchbend(int chan)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) && voice[i].channel == chan)
		{
			recompute_freq(i);
		}
	}
}